

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool __thiscall Memory::Recycler::StartConcurrent(Recycler *this,CollectionState state)

{
  ObservableValue<Memory::CollectionState> *pOVar1;
  CollectionState CVar2;
  ObservableValueObserver<Memory::CollectionState> *pOVar3;
  ThreadService *pTVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  DWORD DVar8;
  undefined4 *puVar9;
  HANDLE hEvent;
  CollectionState local_30;
  CollectionState local_2c;
  
  DVar8 = GetTickCount();
  this->tickCountStartConcurrent = DVar8;
  pOVar1 = &this->collectionState;
  CVar2 = (this->collectionState).value;
  pOVar3 = (this->collectionState).observer;
  local_2c = state;
  if (CVar2 != state && pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) {
    (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,&local_2c,pOVar1);
  }
  (this->collectionState).value = local_2c;
  if (this->threadService->threadService == (ThreadServiceCallback)0x0) {
    if (this->concurrentThread == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1484,"(concurrentThread != 0)","concurrentThread != NULL");
      if (!bVar6) goto LAB_0070e096;
      *puVar9 = 0;
    }
    hEvent = this->concurrentWorkReadyEvent;
    if (hEvent == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1485,"(concurrentWorkReadyEvent != 0)",
                         "concurrentWorkReadyEvent != NULL");
      if (!bVar6) goto LAB_0070e096;
      *puVar9 = 0;
      hEvent = this->concurrentWorkReadyEvent;
    }
    SetEvent(hEvent);
    bVar6 = true;
  }
  else {
    if (this->concurrentThread != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1477,"(concurrentThread == 0)","concurrentThread == NULL");
      if (!bVar6) goto LAB_0070e096;
      *puVar9 = 0;
    }
    if (this->concurrentWorkReadyEvent != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1478,"(concurrentWorkReadyEvent == 0)",
                         "concurrentWorkReadyEvent == NULL");
      if (!bVar6) {
LAB_0070e096:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar9 = 0;
    }
    pTVar4 = this->threadService;
    pTVar4->isInCallback = true;
    bVar7 = (*pTVar4->threadService)(StaticBackgroundWorkCallback,this);
    pTVar4->isInCallback = false;
    bVar6 = true;
    if (!bVar7) {
      pOVar3 = (this->collectionState).observer;
      local_30 = CVar2;
      if ((pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
         ((this->collectionState).value != CVar2)) {
        (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,&local_30,pOVar1);
      }
      pOVar1->value = local_30;
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool
Recycler::StartConcurrent(CollectionState const state)
{
    // Reset the tick count to detect if the concurrent thread is taking too long
    tickCountStartConcurrent = GetTickCount();

    CollectionState oldState = this->collectionState;
    this->SetCollectionState(state);

    if (threadService->HasCallback())
    {
        Assert(concurrentThread == NULL);
        Assert(concurrentWorkReadyEvent == NULL);

        if (!threadService->Invoke(Recycler::StaticBackgroundWorkCallback, this))
        {
            this->SetCollectionState(oldState);
            return false;
        }

        return true;
    }
    else
    {
        Assert(concurrentThread != NULL);
        Assert(concurrentWorkReadyEvent != NULL);

        SetEvent(concurrentWorkReadyEvent);
        return true;
    }
}